

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandAbc9SBmc(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Gia_Man_t *pGia;
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  char *pcVar6;
  char *pcVar7;
  uint local_c0;
  uint local_bc;
  uint local_b8;
  uint local_b4;
  uint local_b0;
  uint local_ac;
  uint local_a8;
  uint local_a4;
  uint local_a0;
  uint local_9c;
  Bmc_AndPar_t Pars;
  
  Pars.nTimeOut = 0;
  Pars.nLutSize = 0;
  Pars._76_4_ = 0;
  Pars.nStart = 0;
  Pars.nFramesMax = 0;
  Pars.nFramesAdd = 0;
  Pars.nConfLimit = 0;
  Pars.nProcs = 1;
  Pars.fLoadCnf = 0;
  Pars.fDumpFrames = 0;
  Pars.fUseSynth = 0;
  Pars.fUseOldCnf = 0;
  Pars.fUseGlucose = 0;
  Pars.fUseEliminate = 0;
  Pars.fVerbose = 0;
  Pars.fVeryVerbose = 0;
  Pars.fNotVerbose = 0;
  Pars.iFrame = 0;
  Pars.nFailOuts = 0;
  Pars.nDropOuts = 0;
  Pars.pFuncOnFrameDone = pAbc->pFuncOnFrameDone;
  local_9c = 0;
  Extra_UtilGetoptReset();
  local_c0 = Pars.nProcs;
  local_a0 = 0;
  local_bc = 1;
  local_b4 = 0;
  local_ac = 0;
  local_b0 = 0;
  local_a8 = 0;
  local_a4 = 0;
  uVar3 = Pars.nFramesMax;
  uVar2 = Pars.nConfLimit;
  local_b8 = local_bc;
LAB_002594ad:
  do {
    iVar1 = Extra_UtilGetopt(argc,argv,"PCFATgevwh");
    iVar5 = globalUtilOptind;
    if (iVar1 == 0x41) {
      if (argc <= globalUtilOptind) {
        pcVar6 = "Command line switch \"-A\" should be followed by an integer.\n";
LAB_00259700:
        Pars.nFramesMax = uVar3;
        Pars.nProcs = local_c0;
        Pars.nConfLimit = uVar2;
        Abc_Print(-1,pcVar6);
        goto LAB_0025970a;
      }
      local_b8 = atoi(argv[globalUtilOptind]);
      uVar4 = local_b8;
    }
    else if (iVar1 == 0x43) {
      if (argc <= globalUtilOptind) {
        pcVar6 = "Command line switch \"-C\" should be followed by an integer.\n";
        goto LAB_00259700;
      }
      uVar2 = atoi(argv[globalUtilOptind]);
      local_a0 = uVar2;
      uVar4 = uVar2;
    }
    else if (iVar1 == 0x46) {
      if (argc <= globalUtilOptind) {
        pcVar6 = "Command line switch \"-F\" should be followed by an integer.\n";
        goto LAB_00259700;
      }
      uVar3 = atoi(argv[globalUtilOptind]);
      local_9c = uVar3;
      uVar4 = uVar3;
    }
    else if (iVar1 == 0x50) {
      if (argc <= globalUtilOptind) {
        pcVar6 = "Command line switch \"-P\" should be followed by an integer.\n";
        goto LAB_00259700;
      }
      local_c0 = atoi(argv[globalUtilOptind]);
      local_bc = local_c0;
      uVar4 = local_c0;
    }
    else {
      if (iVar1 != 0x54) {
        if (iVar1 == 0x65) {
          local_b0 = local_b0 ^ 1;
        }
        else if (iVar1 == 0x67) {
          local_ac = local_ac ^ 1;
        }
        else if (iVar1 == 0x76) {
          local_a8 = local_a8 ^ 1;
        }
        else {
          if (iVar1 != 0x77) {
            if (iVar1 == -1) {
              Pars.nFramesMax = uVar3;
              Pars.nProcs = local_c0;
              Pars.fVeryVerbose = local_a4;
              Pars.fVerbose = local_a8;
              Pars.fUseEliminate = local_b0;
              Pars.fUseGlucose = local_ac;
              Pars.nTimeOut = local_b4;
              Pars.nConfLimit = uVar2;
              Pars.nFramesAdd = local_b8;
              pGia = pAbc->pGia;
              if (pGia == (Gia_Man_t *)0x0) {
                pcVar6 = "Abc_CommandAbc9Bmcs(): There is no AIG.\n";
              }
              else {
                if (local_bc < 5) {
                  if (local_ac == 0) {
                    iVar5 = Bmcs_ManPerform(pGia,&Pars);
                  }
                  else {
                    iVar5 = Bmcg_ManPerform(pGia,&Pars);
                  }
                  pAbc->Status = iVar5;
                  pAbc->nFrames = Pars.iFrame;
                  Abc_FrameReplaceCex(pAbc,&pAbc->pGia->pCexSeq);
                  return 0;
                }
                pcVar6 = 
                "Abc_CommandAbc9Bmcs(): Currently this command can run at most 4 concurrent solvers.\n"
                ;
              }
              Abc_Print(-1,pcVar6);
              return 0;
            }
            goto LAB_00259664;
          }
          local_a4 = local_a4 ^ 1;
        }
        goto LAB_002594ad;
      }
      if (argc <= globalUtilOptind) {
        pcVar6 = "Command line switch \"-T\" should be followed by an integer.\n";
        goto LAB_00259700;
      }
      local_b4 = atoi(argv[globalUtilOptind]);
      uVar4 = local_b4;
    }
    globalUtilOptind = iVar5 + 1;
    if ((int)uVar4 < 0) {
LAB_00259664:
      Pars.nFramesMax = uVar3;
      Pars.nConfLimit = uVar2;
      Pars.nProcs = local_c0;
LAB_0025970a:
      Abc_Print(-2,"usage: &bmcs [-PCFAT num] [-gevwh]\n");
      Abc_Print(-2,"\t         performs bounded model checking\n");
      Abc_Print(-2,"\t-P num : the number of parallel solvers [default = %d]\n",(ulong)local_bc);
      Abc_Print(-2,"\t-C num : the SAT solver conflict limit [default = %d]\n",(ulong)local_a0);
      Abc_Print(-2,"\t-F num : the maximum number of timeframes [default = %d]\n",(ulong)local_9c);
      Abc_Print(-2,"\t-A num : the number of additional frames to unroll [default = %d]\n",
                (ulong)local_b8);
      Abc_Print(-2,"\t-T num : approximate timeout in seconds [default = %d]\n",(ulong)local_b4);
      pcVar6 = "Glucose";
      if (local_ac == 0) {
        pcVar6 = "Satoko";
      }
      Abc_Print(-2,
                "\t-g     : toggle using Glucose 3.0 by Gilles Audemard and Laurent Simon [default = %s]\n"
                ,pcVar6);
      pcVar7 = "yes";
      pcVar6 = "yes";
      if (local_b0 == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-e     : toggle using variable eliminatation [default = %s]\n",pcVar6);
      pcVar6 = "yes";
      if (local_a8 == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar6);
      if (local_a4 == 0) {
        pcVar7 = "no";
      }
      Abc_Print(-2,"\t-w     : toggle printing information about unfolding [default = %s]\n",pcVar7)
      ;
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9SBmc( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern int Bmcs_ManPerform( Gia_Man_t * pGia, Bmc_AndPar_t * pPars );
    extern int Bmcg_ManPerform( Gia_Man_t * pGia, Bmc_AndPar_t * pPars );
    Bmc_AndPar_t Pars, * pPars = &Pars; int c;
    memset( pPars, 0, sizeof(Bmc_AndPar_t) );
    pPars->nStart        =    0;  // starting timeframe
    pPars->nFramesMax    =    0;  // maximum number of timeframes
    pPars->nFramesAdd    =    1;  // the number of additional frames
    pPars->nConfLimit    =    0;  // maximum number of conflicts at a node
    pPars->nTimeOut      =    0;  // timeout in seconds
    pPars->nLutSize      =    0;  // max LUT size for CNF computation
    pPars->nProcs        =    1;  // the number of parallel solvers
    pPars->fLoadCnf      =    0;  // dynamic CNF loading
    pPars->fDumpFrames   =    0;  // dump unrolled timeframes
    pPars->fUseSynth     =    0;  // use synthesis
    pPars->fUseOldCnf    =    0;  // use old CNF construction
    pPars->fUseGlucose   =    0;  // use Glucose 3.0
    pPars->fUseEliminate =    0;  // use variable elimination
    pPars->fVerbose      =    0;  // verbose
    pPars->fVeryVerbose  =    0;  // very verbose
    pPars->fNotVerbose   =    0;  // skip line-by-line print-out
    pPars->iFrame        =    0;  // explored up to this frame
    pPars->nFailOuts     =    0;  // the number of failed outputs
    pPars->nDropOuts     =    0;  // the number of dropped outputs
    pPars->pFuncOnFrameDone = pAbc->pFuncOnFrameDone; // frame done callback

    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "PCFATgevwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'P':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-P\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nProcs = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nProcs < 0 )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nConfLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nConfLimit < 0 )
                goto usage;
            break;
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nFramesMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nFramesMax < 0 )
                goto usage;
            break;
        case 'A':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-A\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nFramesAdd = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nFramesAdd < 0 )
                goto usage;
            break;
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nTimeOut = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nTimeOut < 0 )
                goto usage;
            break;
        case 'g':
            pPars->fUseGlucose ^= 1;
            break;
        case 'e':
            pPars->fUseEliminate ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'w':
            pPars->fVeryVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Bmcs(): There is no AIG.\n" );
        return 0;
    }
    if ( pPars->nProcs > 4 )
    {
        Abc_Print( -1, "Abc_CommandAbc9Bmcs(): Currently this command can run at most 4 concurrent solvers.\n" );
        return 0;
    }
    pAbc->Status  = pPars->fUseGlucose ? Bmcg_ManPerform(pAbc->pGia, pPars) : Bmcs_ManPerform(pAbc->pGia, pPars);
    pAbc->nFrames = pPars->iFrame;
    Abc_FrameReplaceCex( pAbc, &pAbc->pGia->pCexSeq );
    return 0;

usage:
    Abc_Print( -2, "usage: &bmcs [-PCFAT num] [-gevwh]\n" );
    Abc_Print( -2, "\t         performs bounded model checking\n" );
    Abc_Print( -2, "\t-P num : the number of parallel solvers [default = %d]\n",              pPars->nProcs );
    Abc_Print( -2, "\t-C num : the SAT solver conflict limit [default = %d]\n",               pPars->nConfLimit );
    Abc_Print( -2, "\t-F num : the maximum number of timeframes [default = %d]\n",            pPars->nFramesMax );
    Abc_Print( -2, "\t-A num : the number of additional frames to unroll [default = %d]\n",   pPars->nFramesAdd );
    Abc_Print( -2, "\t-T num : approximate timeout in seconds [default = %d]\n",              pPars->nTimeOut );
    Abc_Print( -2, "\t-g     : toggle using Glucose 3.0 by Gilles Audemard and Laurent Simon [default = %s]\n", pPars->fUseGlucose?  "Glucose" : "Satoko" );
    Abc_Print( -2, "\t-e     : toggle using variable eliminatation [default = %s]\n",         pPars->fUseEliminate?"yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n",         pPars->fVerbose?     "yes": "no" );
    Abc_Print( -2, "\t-w     : toggle printing information about unfolding [default = %s]\n", pPars->fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}